

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::OptTagChecks(GlobOpt *this,Instr *instr)

{
  short sVar1;
  code *pcVar2;
  anon_class_32_4_be7ea101 fn;
  SymOpnd *sym;
  bool bVar3;
  IRType type;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar4;
  PropertySym *pPVar5;
  GlobOptBlockData *this_00;
  Sym *pSVar6;
  StackSym *this_01;
  ValueInfo *pVVar7;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar8;
  undefined4 *puVar9;
  RegOpnd *local_60;
  RegOpnd *srcOpnd;
  Instr *bailOutInstr;
  ValueType newValueType;
  ValueInfo *pVStack_48;
  ValueType valueType;
  ValueInfo *valInfo;
  Value *value;
  RegOpnd *regOpnd;
  SymOpnd *symOpnd;
  StackSym *stackSym;
  Instr *instr_local;
  GlobOpt *this_local;
  
  stackSym = (StackSym *)instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,OptTagChecksPhase,sourceContextId,functionId);
  if ((bVar3) || (bVar3 = DoTagChecks(this), !bVar3)) {
    return false;
  }
  symOpnd = (SymOpnd *)0x0;
  regOpnd = (RegOpnd *)0x0;
  value = (Value *)0x0;
  sVar1 = *(short *)&stackSym->m_tempNumberSym;
  if ((sVar1 != 0x5e) && (sVar1 != 0x6c)) {
    if (sVar1 == 0x70) {
      pOVar4 = IR::Instr::GetDst((Instr *)stackSym);
      regOpnd = (RegOpnd *)IR::Opnd::AsSymOpnd(pOVar4);
      pPVar5 = Sym::AsPropertySym(((SymOpnd *)regOpnd)->m_sym);
      symOpnd = (SymOpnd *)pPVar5->m_stackSym;
      goto LAB_005899a3;
    }
    if ((sVar1 == 0x239) || (sVar1 == 0x23c)) {
      pOVar4 = IR::Instr::GetSrc1((Instr *)stackSym);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar4);
      if (bVar3) {
        pOVar4 = IR::Instr::GetSrc1((Instr *)stackSym);
        value = (Value *)IR::Opnd::AsRegOpnd(pOVar4);
        symOpnd = (SymOpnd *)((RegOpnd *)value)->m_sym;
      }
      goto LAB_005899a3;
    }
    if ((sVar1 != 0x270) && (sVar1 != 0x273)) goto LAB_005899a3;
  }
  pOVar4 = IR::Instr::GetSrc1((Instr *)stackSym);
  regOpnd = (RegOpnd *)IR::Opnd::AsSymOpnd(pOVar4);
  pPVar5 = Sym::AsPropertySym(((SymOpnd *)regOpnd)->m_sym);
  symOpnd = (SymOpnd *)pPVar5->m_stackSym;
LAB_005899a3:
  if (symOpnd != (SymOpnd *)0x0) {
    this_00 = CurrentBlockData(this);
    valInfo = (ValueInfo *)GlobOptBlockData::FindValue(this_00,(Sym *)symOpnd);
    if (valInfo != (ValueInfo *)0x0) {
      pVStack_48 = ::Value::GetValueInfo((Value *)valInfo);
      pSVar6 = ValueInfo::GetSymStore(pVStack_48);
      if (pSVar6 != (Sym *)0x0) {
        pSVar6 = ValueInfo::GetSymStore(pVStack_48);
        bVar3 = Sym::IsStackSym(pSVar6);
        if (bVar3) {
          pSVar6 = ValueInfo::GetSymStore(pVStack_48);
          this_01 = Sym::AsStackSym(pSVar6);
          bVar3 = StackSym::IsFromByteCodeConstantTable(this_01);
          if (bVar3) {
            return false;
          }
        }
      }
      pVVar7 = ::Value::GetValueInfo((Value *)valInfo);
      paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
               ValueInfo::Type(pVVar7);
      bailOutInstr._6_2_ = *paVar8;
      if (*(short *)&stackSym->m_tempNumberSym == 0x239) {
        bVar3 = ValueType::CanBeTaggedValue((ValueType *)((long)&bailOutInstr + 6));
        pVVar7 = valInfo;
        if (!bVar3) {
          bVar3 = IsLoopPrePass(this);
          if (!bVar3) {
            if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              InsertByteCodeUses(this,(Instr *)stackSym,false);
            }
            BasicBlock::RemoveInstr(this->currentBlock,(Instr *)stackSym);
          }
          return true;
        }
        bailOutInstr._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue((ValueType *)((long)&bailOutInstr + 6),false);
        ChangeValueType(this,(BasicBlock *)0x0,(Value *)pVVar7,(ValueType)bailOutInstr._4_2_,true,
                        false);
        return false;
      }
      bVar3 = ValueType::CanBeTaggedValue((ValueType *)((long)&bailOutInstr + 6));
      if (((bVar3) &&
          (bVar3 = ValueType::HasBeenNumber((ValueType *)((long)&bailOutInstr + 6)), !bVar3)) &&
         (bVar3 = IsLoopPrePass(this), !bVar3)) {
        bailOutInstr._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue((ValueType *)((long)&bailOutInstr + 6),false);
        srcOpnd = (RegOpnd *)
                  IR::BailOutInstrTemplate<IR::Instr>::New
                            (BailOnNotObject,BailOutOnTaggedValue,(Instr *)stackSym,
                             *(Func **)&stackSym->m_offset);
        bVar3 = IsLoopPrePass(this);
        if (!bVar3) {
          FillBailOutInfo(this,this->currentBlock,(Instr *)srcOpnd);
        }
        sym = symOpnd;
        local_60 = (RegOpnd *)value;
        if (value == (Value *)0x0) {
          type = StackSym::GetType((StackSym *)symOpnd);
          local_60 = IR::RegOpnd::New((StackSym *)sym,type,*(Func **)&stackSym->m_offset);
          if (regOpnd == (RegOpnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xb84,"(symOpnd)","symOpnd");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          bVar3 = IR::Opnd::GetIsJITOptimizedReg(&regOpnd->super_Opnd);
          if (bVar3) {
            IR::Opnd::SetIsJITOptimizedReg(&local_60->super_Opnd,true);
          }
        }
        IR::Instr::SetSrc1((Instr *)srcOpnd,&local_60->super_Opnd);
        pOVar4 = IR::Instr::GetSrc1((Instr *)srcOpnd);
        IR::Opnd::SetValueType(pOVar4,(ValueType)bailOutInstr._6_2_);
        IR::Instr::SetByteCodeOffset((Instr *)srcOpnd,(Instr *)stackSym);
        IR::Instr::InsertBefore((Instr *)stackSym,(Instr *)srcOpnd);
        if (this->currentBlock->loop != (Loop *)0x0) {
          fn.bailOutInstr = (Instr **)&srcOpnd;
          fn.this = this;
          fn.value = (Value **)&valInfo;
          fn.stackSym = (StackSym **)&symOpnd;
          TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::OptTagChecks(IR::Instr*)::__0>
                    (this,(Instr *)srcOpnd,fn);
        }
        if (regOpnd == (RegOpnd *)0x0) {
          IR::Opnd::SetValueType((Opnd *)value,(ValueType)bailOutInstr._2_2_);
        }
        else {
          IR::SymOpnd::SetPropertyOwnerValueType((SymOpnd *)regOpnd,(ValueType)bailOutInstr._2_2_);
        }
        ChangeValueType(this,(BasicBlock *)0x0,(Value *)valInfo,(ValueType)bailOutInstr._2_2_,false,
                        false);
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptTagChecks(IR::Instr *instr)
{
    if (PHASE_OFF(Js::OptTagChecksPhase, this->func) || !this->DoTagChecks())
    {
        return false;
    }

    StackSym *stackSym = nullptr;
    IR::SymOpnd *symOpnd = nullptr;
    IR::RegOpnd *regOpnd = nullptr;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::CheckFixedFld:
    case Js::OpCode::CheckPropertyGuardAndLoadType:
        symOpnd = instr->GetSrc1()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;

    case Js::OpCode::BailOnNotObject:
    case Js::OpCode::BailOnNotArray:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            regOpnd = instr->GetSrc1()->AsRegOpnd();
            stackSym = regOpnd->m_sym;
        }
        break;

    case Js::OpCode::StFld:
        symOpnd = instr->GetDst()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;
    }

    if (stackSym)
    {
        Value *value = CurrentBlockData()->FindValue(stackSym);
        if (value)
        {
            ValueInfo *valInfo = value->GetValueInfo();
            if (valInfo->GetSymStore() && valInfo->GetSymStore()->IsStackSym() && valInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
            {
                return false;
            }
            ValueType valueType = value->GetValueInfo()->Type();
            if (instr->m_opcode == Js::OpCode::BailOnNotObject)
            {
                if (valueType.CanBeTaggedValue())
                {
                    // We're not adding new information to the value other than changing the value type. Preserve any existing
                    // information and just change the value type.
                    ChangeValueType(nullptr, value, valueType.SetCanBeTaggedValue(false), true /*preserveSubClassInfo*/);
                    return false;
                }
                if (!this->IsLoopPrePass())
                {
                    if (this->byteCodeUses)
                    {
                        this->InsertByteCodeUses(instr);
                    }
                    this->currentBlock->RemoveInstr(instr);
                }
                return true;
            }

            if (valueType.CanBeTaggedValue() &&
                !valueType.HasBeenNumber() &&
                !this->IsLoopPrePass())
            {
                ValueType newValueType = valueType.SetCanBeTaggedValue(false);

                // Split out the tag check as a separate instruction.
                IR::Instr *bailOutInstr;
                bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, IR::BailOutOnTaggedValue, instr, instr->m_func);
                if (!this->IsLoopPrePass())
                {
                    FillBailOutInfo(this->currentBlock, bailOutInstr);
                }
                IR::RegOpnd *srcOpnd = regOpnd;
                if (!srcOpnd)
                {
                    srcOpnd = IR::RegOpnd::New(stackSym, stackSym->GetType(), instr->m_func);
                    AnalysisAssert(symOpnd);
                    if (symOpnd->GetIsJITOptimizedReg())
                    {
                        srcOpnd->SetIsJITOptimizedReg(true);
                    }
                }
                bailOutInstr->SetSrc1(srcOpnd);
                bailOutInstr->GetSrc1()->SetValueType(valueType);
                bailOutInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(bailOutInstr);
                if (this->currentBlock->loop)
                {
                    // Try hoisting the BailOnNotObject instr.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(bailOutInstr, [&]()
                    {
                        if (TryHoistInvariant(bailOutInstr, this->currentBlock, nullptr, value, nullptr, true, false, false, IR::BailOutOnTaggedValue))
                        {
                            Value* landingPadValue = this->currentBlock->loop->landingPad->globOptData.FindValue(stackSym);
                            ValueType newLandingPadValueType = landingPadValue->GetValueInfo()->Type().SetCanBeTaggedValue(false);
                            ChangeValueType(nullptr, landingPadValue, newLandingPadValueType, false);
                        }
                    });
                }
                if (symOpnd)
                {
                    symOpnd->SetPropertyOwnerValueType(newValueType);
                }
                else
                {
                    regOpnd->SetValueType(newValueType);
                }
                ChangeValueType(nullptr, value, newValueType, false);
            }
        }
    }

    return false;
}